

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindHeader_abi_cxx11_(string *__return_storage_ptr__,cmFindPathCommand *this)

{
  cmFindBaseDebugState debug;
  string sStack_d8;
  string local_b8;
  cmFindBaseDebugState local_98;
  
  std::__cxx11::string::string
            ((string *)&local_b8,(string *)&(this->super_cmFindBase).FindCommandName);
  cmFindBaseDebugState::cmFindBaseDebugState(&local_98,&local_b8,&this->super_cmFindBase);
  std::__cxx11::string::~string((string *)&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == true)) {
    FindFrameworkHeader_abi_cxx11_(&sStack_d8,this,&local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    if (__return_storage_ptr__->_M_string_length != 0) goto LAB_001c8fde;
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == false) {
    FindNormalHeader_abi_cxx11_(&sStack_d8,this,&local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    if (__return_storage_ptr__->_M_string_length != 0) goto LAB_001c8fde;
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkLast == true) {
    FindFrameworkHeader_abi_cxx11_(&sStack_d8,this,&local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
LAB_001c8fde:
  cmFindBaseDebugState::~cmFindBaseDebugState(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeader()
{
  cmFindBaseDebugState debug(this->FindCommandName, this);
  std::string header;
  if (this->SearchFrameworkFirst || this->SearchFrameworkOnly) {
    header = this->FindFrameworkHeader(debug);
  }
  if (header.empty() && !this->SearchFrameworkOnly) {
    header = this->FindNormalHeader(debug);
  }
  if (header.empty() && this->SearchFrameworkLast) {
    header = this->FindFrameworkHeader(debug);
  }

  return header;
}